

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode
JsCreateCustomExternalObject
          (void *data,size_t inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsGetterSetterInterceptor **getterSetterInterceptor,
          JsValueRef prototype,JsValueRef *object)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode exitStatus;
  BOOL BVar4;
  JsrtContext *currentContext;
  RecyclableObject *pRVar5;
  CustomExternalWrapperObject *pCVar6;
  undefined4 *puVar7;
  AutoNestedHandledExceptionType local_88 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  JsGetterSetterInterceptor *interceptor;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  exitStatus = CheckContext(currentContext,false,false);
  if (exitStatus != JsNoError) goto LAB_003b303f;
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_88,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTAllocateExternalObject
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48,
               prototype);
  }
  if (object == (JsValueRef *)0x0) {
    exitStatus = JsErrorNullArgument;
  }
  else {
    if (prototype == (JsValueRef)0x0) {
      pRVar5 = (RecyclableObject *)0x0;
    }
    else {
      BVar4 = Js::JavascriptOperators::IsObjectOrNull(prototype);
      if (BVar4 == 0) {
        exitStatus = JsErrorArgumentNotObject;
        goto LAB_003b3036;
      }
      pRVar5 = Js::VarTo<Js::RecyclableObject>(prototype);
      pSVar1 = (((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003b3036;
        prototype = Js::CrossSite::MarshalVar(scriptContext,pRVar5,false);
      }
      pRVar5 = Js::VarTo<Js::RecyclableObject>(prototype);
    }
    exitStatus = JsErrorInvalidArgument;
    if (inlineSlotSize >> 0x20 == 0) {
      _actionEntryPopper.m_resultPtr = (TTDVar *)0x0;
      pCVar6 = Js::CustomExternalWrapperObject::Create
                         (data,(uint)inlineSlotSize,traceCallback,finalizeCallback,
                          (JsGetterSetterInterceptor **)&_actionEntryPopper.m_resultPtr,pRVar5,
                          scriptContext);
      *object = pCVar6;
      if (_actionEntryPopper.m_resultPtr == (TTDVar *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                           ,0x2ba,"(interceptor)","interceptor");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      *getterSetterInterceptor = (JsGetterSetterInterceptor *)_actionEntryPopper.m_resultPtr;
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        TTD::TTDJsRTActionResultAutoRecorder::SetResult
                  ((TTDJsRTActionResultAutoRecorder *)auStack_48,object);
      }
      exitStatus = JsNoError;
    }
  }
LAB_003b3036:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_88);
LAB_003b303f:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_48,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsCreateCustomExternalObject(
    _In_opt_ void *data,
    _In_opt_ size_t inlineSlotSize,
    _In_opt_ JsTraceCallback traceCallback,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _Inout_opt_ JsGetterSetterInterceptor ** getterSetterInterceptor,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef * object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT_OR_NULL(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }
        if (inlineSlotSize > UINT32_MAX)
        {
            return JsErrorInvalidArgument;
        }

        Js::JsGetterSetterInterceptor * interceptor = nullptr;
        *object = Js::CustomExternalWrapperObject::Create(data, (uint)inlineSlotSize, traceCallback, finalizeCallback, &interceptor, prototypeObject, scriptContext);
        Assert(interceptor);
        *getterSetterInterceptor = reinterpret_cast<JsGetterSetterInterceptor*>(interceptor);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}